

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  Array<char> *pAVar3;
  char *pcVar4;
  void *pvVar5;
  Format FVar6;
  int iVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  uint *puVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  LineBuffer *pLVar13;
  long *plVar14;
  char *pcVar15;
  Data *pDVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPSCANLINE_abi_cxx11_);
  pBVar8 = Header::dataWindow(header);
  pLVar9 = Header::lineOrder(header);
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).y;
  iVar21 = iVar1;
  if (*pLVar9 == INCREASING_Y) {
    iVar21 = iVar7;
  }
  pDVar16 = this->_data;
  pDVar16->currentScanLine = iVar21;
  pDVar16->missingScanLines = (iVar1 - iVar7) + 1;
  pLVar9 = Header::lineOrder(header);
  pDVar16 = this->_data;
  pDVar16->lineOrder = *pLVar9;
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).x;
  iVar21 = (pBVar8->max).y;
  pDVar16->minX = (pBVar8->min).x;
  pDVar16->maxX = iVar1;
  pDVar16->minY = iVar7;
  pDVar16->maxY = iVar21;
  iVar21 = iVar21 - iVar7;
  uVar19 = 0xffffffffffffffff;
  if (-2 < iVar21) {
    uVar19 = (long)iVar21 * 4 + 4;
  }
  puVar10 = (uint *)operator_new__(uVar19);
  puVar2 = (pDVar16->lineSampleCount)._data;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  (pDVar16->lineSampleCount)._size = (long)iVar21 + 1;
  (pDVar16->lineSampleCount)._data = puVar10;
  pCVar11 = Header::compression(&this->_data->header);
  pCVar12 = newCompressor(*pCVar11,0,&this->_data->header);
  FVar6 = defaultFormat(pCVar12);
  this->_data->format = FVar6;
  iVar7 = numLinesInBuffer(pCVar12);
  this->_data->linesInBuffer = iVar7;
  if (pCVar12 != (Compressor *)0x0) {
    (*pCVar12->_vptr_Compressor[1])(pCVar12);
  }
  pDVar16 = this->_data;
  iVar7 = ((pDVar16->maxY - pDVar16->minY) + pDVar16->linesInBuffer) / pDVar16->linesInBuffer;
  Header::setChunkCount(&pDVar16->header,iVar7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar7);
  pDVar16 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar16->bytesPerLine,(long)((pDVar16->maxY - pDVar16->minY) + 1));
  pDVar16 = this->_data;
  iVar7 = (pDVar16->maxY - pDVar16->minY) + 1;
  if (pDVar16->linesInBuffer <= iVar7) {
    iVar7 = pDVar16->linesInBuffer;
  }
  pDVar16->maxSampleCountTableSize = (long)(((pDVar16->maxX - pDVar16->minX) + 1) * iVar7) << 2;
  pDVar16 = this->_data;
  if ((pDVar16->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar16->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      pLVar13 = (LineBuffer *)operator_new(200);
      iVar7 = pDVar16->linesInBuffer;
      lVar17 = (long)iVar7;
      pLVar13->sampleCountTableCompressor = (Compressor *)0x0;
      pLVar13->compressor = (Compressor *)0x0;
      pLVar13->partiallyFull = false;
      pLVar13->hasException = false;
      (pLVar13->buffer)._size = 0;
      (pLVar13->buffer)._data = (Array<char> *)0x0;
      (pLVar13->consecutiveBuffer)._size = 0;
      (pLVar13->consecutiveBuffer)._data = (char *)0x0;
      pLVar13->dataPtr = (char *)0x0;
      pLVar13->dataSize = 0;
      (pLVar13->sampleCountTableBuffer)._size = 0;
      *(undefined1 (*) [16])&(pLVar13->sampleCountTableBuffer)._data = (undefined1  [16])0x0;
      (pLVar13->exception)._M_dataplus._M_p = (pointer)&(pLVar13->exception).field_2;
      (pLVar13->exception)._M_string_length = 0;
      (pLVar13->exception).field_2._M_local_buf[0] = '\0';
      IlmThread_3_4::Semaphore::Semaphore(&pLVar13->_sem,1);
      uVar18 = lVar17 * 0x10 + 8;
      if (iVar7 < 0) {
        uVar18 = 0xffffffffffffffff;
      }
      plVar14 = (long *)operator_new__(uVar18);
      *plVar14 = lVar17;
      if (iVar7 != 0) {
        memset((Array<char> *)(plVar14 + 1),0,lVar17 * 0x10);
      }
      pAVar3 = (pLVar13->buffer)._data;
      if (pAVar3 != (Array<char> *)0x0) {
        pcVar4 = pAVar3[-1]._data;
        if (pcVar4 != (char *)0x0) {
          lVar20 = (long)pcVar4 << 4;
          do {
            pvVar5 = *(void **)((long)&pAVar3[-1]._data + lVar20);
            if (pvVar5 != (void *)0x0) {
              operator_delete__(pvVar5);
            }
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
        }
        operator_delete__(&pAVar3[-1]._data,(long)pcVar4 << 4 | 8);
      }
      (pLVar13->buffer)._size = lVar17;
      (pLVar13->buffer)._data = (Array<char> *)(plVar14 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar19] = pLVar13;
      uVar18 = this->_data->maxSampleCountTableSize;
      pLVar13 = (this->_data->lineBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19];
      pcVar15 = (char *)operator_new__(uVar18);
      pcVar4 = (pLVar13->sampleCountTableBuffer)._data;
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
      (pLVar13->sampleCountTableBuffer)._size = uVar18;
      (pLVar13->sampleCountTableBuffer)._data = pcVar15;
      pCVar11 = Header::compression(&this->_data->header);
      pCVar12 = newCompressor(*pCVar11,this->_data->maxSampleCountTableSize,&this->_data->header);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar19]->sampleCountTableCompressor = pCVar12;
      uVar19 = uVar19 + 1;
      pDVar16 = this->_data;
    } while (uVar19 < (ulong)((long)(pDVar16->lineBuffers).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pDVar16->lineBuffers).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header& header)
{
    _data->header = header;

    _data->header.setType (DEEPSCANLINE);

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

    Compressor* compressor =
        newCompressor (_data->header.compression (), 0, _data->header);
    _data->format        = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0) delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY + _data->linesInBuffer) /
                         _data->linesInBuffer;

    _data->header.setChunkCount (lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize =
        min (_data->linesInBuffer, _data->maxY - _data->minY + 1) *
        (_data->maxX - _data->minX + 1) * sizeof (unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        _data->lineBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}